

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O0

bool __thiscall draco::ObjEncoder::ExitAndCleanup(ObjEncoder *this,bool return_value)

{
  byte in_SIL;
  undefined8 *in_RDI;
  
  in_RDI[0xb] = 0;
  in_RDI[10] = 0;
  in_RDI[9] = 0;
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  *(undefined4 *)(in_RDI + 0x13) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1b) = 0xffffffff;
  std::__cxx11::string::clear();
  return (bool)(in_SIL & 1);
}

Assistant:

bool ObjEncoder::ExitAndCleanup(bool return_value) {
  in_mesh_ = nullptr;
  in_point_cloud_ = nullptr;
  out_buffer_ = nullptr;
  pos_att_ = nullptr;
  tex_coord_att_ = nullptr;
  normal_att_ = nullptr;
  material_att_ = nullptr;
  sub_obj_att_ = nullptr;
  added_edges_att_ = nullptr;
  current_sub_obj_id_ = -1;
  current_material_id_ = -1;
  file_name_.clear();
  return return_value;
}